

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acceln.cpp
# Opt level: O2

void __thiscall embree::AccelN::accels_build(AccelN *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  Accel *pAVar3;
  undefined8 uVar4;
  char cVar5;
  task *ptVar6;
  runtime_error *this_00;
  char *pcVar7;
  size_t i_1;
  long lVar8;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  char *pcVar14;
  size_t i;
  char *pcVar15;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar18;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar19;
  auto_partitioner local_e9;
  AccelN **local_e8;
  task_traits local_e0;
  AccelN *local_d8;
  undefined8 local_d0;
  undefined4 local_c8;
  wait_context local_c0;
  task_group_context context;
  
  std::vector<embree::Accel_*,_std::allocator<embree::Accel_*>_>::_M_shrink_to_fit(&this->accels);
  ppAVar1 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppAVar2 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_d8 = this;
  tbb::detail::d1::task_group_context::task_group_context(&context,(context_traits)0x4,CUSTOM_CTX);
  local_e8 = &local_d8;
  if (ppAVar1 != ppAVar2) {
    local_e0.m_version_and_traits = 0;
    ptVar6 = (task *)tbb::detail::r1::allocate((small_object_pool **)&local_e0,0xc0);
    ptVar6->m_reserved[3] = 0;
    ptVar6->m_reserved[4] = 0;
    ptVar6->m_reserved[5] = 0;
    ptVar6->m_reserved[1] = 0;
    ptVar6->m_reserved[2] = 0;
    (ptVar6->super_task_traits).m_version_and_traits = 0;
    ptVar6->m_reserved[0] = 0;
    ptVar6->_vptr_task = (_func_int **)&PTR__task_021d39b0;
    ptVar6[1]._vptr_task = (_func_int **)((long)ppAVar1 - (long)ppAVar2 >> 3);
    ptVar6[1].super_task_traits.m_version_and_traits = 0;
    ptVar6[1].m_reserved[0] = 1;
    ptVar6[1].m_reserved[1] = (uint64_t)&local_e8;
    ptVar6[1].m_reserved[2] = 0;
    ptVar6[1].m_reserved[3] = 1;
    tbb::detail::d1::auto_partition_type::auto_partition_type
              ((auto_partition_type *)(ptVar6[1].m_reserved + 5),&local_e9);
    ptVar6[2].super_task_traits.m_version_and_traits = local_e0.m_version_and_traits;
    local_d0 = 0;
    local_c8 = 1;
    local_c0.m_version_and_traits = 1;
    local_c0.m_ref_count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)1;
    ptVar6[1].m_reserved[4] = (uint64_t)&local_d0;
    tbb::detail::r1::execute_and_wait(ptVar6,&context,&local_c0,&context);
  }
  cVar5 = tbb::detail::r1::is_group_execution_cancelled(&context);
  if (cVar5 == '\0') {
    tbb::detail::d1::task_group_context::~task_group_context(&context);
    ppAVar1 = (this->accels).super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar8 = (long)(this->accels).
                  super__Vector_base<embree::Accel_*,_std::allocator<embree::Accel_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppAVar1;
    pcVar7 = (char *)(lVar8 >> 3);
    bVar13 = true;
    bVar12 = true;
    bVar11 = true;
    bVar10 = true;
    for (pcVar15 = (char *)0x0; pcVar7 != pcVar15; pcVar15 = pcVar15 + 1) {
      pAVar3 = ppAVar1[(long)pcVar15];
      bVar13 = (bool)(bVar13 & *(long *)&pAVar3->field_0x90 != 0);
      bVar12 = (bool)(bVar12 & *(long *)&pAVar3->field_0xa8 != 0);
      bVar11 = (bool)(bVar11 & *(long *)&pAVar3->field_0xf0 != 0);
      bVar10 = (bool)(bVar10 & *(long *)&pAVar3->field_0x138 != 0);
    }
    if (lVar8 == 8) {
      (this->super_Accel).super_AccelData.type = ((*ppAVar1)->super_AccelData).type;
      pAVar3 = *ppAVar1;
      uVar4 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds0 + 8);
      *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 =
           *(undefined8 *)&(pAVar3->super_AccelData).bounds.bounds0.lower.field_0;
      *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 + 8) =
           uVar4;
      uVar4 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds0 + 0x18);
      *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 =
           *(undefined8 *)
            &((Vec3fa *)((long)&(pAVar3->super_AccelData).bounds.bounds0 + 0x10))->field_0;
      *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 + 8) =
           uVar4;
      uVar4 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds1 + 8);
      *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 =
           *(undefined8 *)&(pAVar3->super_AccelData).bounds.bounds1.lower.field_0;
      *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 + 8) =
           uVar4;
      uVar4 = *(undefined8 *)((long)&(pAVar3->super_AccelData).bounds.bounds1 + 0x18);
      *(undefined8 *)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 =
           *(undefined8 *)
            &((Vec3fa *)((long)&(pAVar3->super_AccelData).bounds.bounds1 + 0x10))->field_0;
      *(undefined8 *)((long)&(this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 + 8) =
           uVar4;
      memcpy(&(this->super_Accel).super_AccelData.field_0x58,
             &((*ppAVar1)->super_AccelData).field_0x58,0x118);
    }
    else {
      (this->super_Accel).super_AccelData.type = TY_ACCELN;
      *(AccelN **)&(this->super_Accel).super_AccelData.field_0x58 = this;
      pcVar9 = (char *)0x0;
      pcVar15 = "AccelN::intersector1";
      if (!bVar13) {
        pcVar15 = pcVar9;
      }
      *(code **)&(this->super_Accel).field_0x78 = intersect;
      *(code **)&(this->super_Accel).field_0x80 = occluded;
      *(code **)&(this->super_Accel).field_0x88 = pointQuery;
      pcVar14 = "AccelN::intersector4";
      if (!bVar12) {
        pcVar14 = pcVar9;
      }
      *(char **)&(this->super_Accel).field_0x90 = pcVar15;
      *(code **)&(this->super_Accel).field_0x98 = intersect4;
      *(code **)&(this->super_Accel).field_0xa0 = occluded4;
      *(char **)&(this->super_Accel).field_0xa8 = pcVar14;
      pcVar15 = "AccelN::intersector8";
      if (!bVar11) {
        pcVar15 = pcVar9;
      }
      *(code **)&(this->super_Accel).field_0xe0 = intersect8;
      *(code **)&(this->super_Accel).field_0xe8 = occluded8;
      *(char **)&(this->super_Accel).field_0xf0 = pcVar15;
      pcVar15 = "AccelN::intersector16";
      if (!bVar10) {
        pcVar15 = pcVar9;
      }
      *(code **)&(this->super_Accel).field_0x128 = intersect16;
      *(code **)&(this->super_Accel).field_0x130 = occluded16;
      *(char **)&(this->super_Accel).field_0x138 = pcVar15;
      aVar16 = _DAT_01f45a30;
      (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 = _DAT_01f45a30;
      aVar17 = _DAT_01f45a40;
      (this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 = _DAT_01f45a40;
      (this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 = aVar16;
      (this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 = aVar17;
      aVar18 = aVar17;
      aVar19 = aVar16;
      for (; pcVar7 != pcVar9; pcVar9 = pcVar9 + 1) {
        pAVar3 = ppAVar1[(long)pcVar9];
        aVar19.m128 = (__m128)minps(aVar19.m128,
                                    (pAVar3->super_AccelData).bounds.bounds0.lower.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds0.lower.field_0 = aVar19;
        aVar18.m128 = (__m128)maxps(aVar18.m128,
                                    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                                     ((long)&(pAVar3->super_AccelData).bounds.bounds0 + 0x10));
        (this->super_Accel).super_AccelData.bounds.bounds0.upper.field_0 = aVar18;
        aVar16.m128 = (__m128)minps(aVar16.m128,
                                    (pAVar3->super_AccelData).bounds.bounds1.lower.field_0);
        (this->super_Accel).super_AccelData.bounds.bounds1.lower.field_0 = aVar16;
        aVar17.m128 = (__m128)maxps(aVar17.m128,
                                    *(anon_union_16_2_47237d3f_for_Vec3fa_0 *)
                                     ((long)&(pAVar3->super_AccelData).bounds.bounds1 + 0x10));
        (this->super_Accel).super_AccelData.bounds.bounds1.upper.field_0 = aVar17;
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"task cancelled");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void AccelN::accels_build () 
  {
    /* reduce memory consumption */
    accels.shrink_to_fit();
    
    /* build all acceleration structures in parallel */
    parallel_for (accels.size(), [&] (size_t i) { 
        accels[i]->build();
      });

    /* create list of non-empty acceleration structures */
    bool valid1 = true;
    bool valid4 = true;
    bool valid8 = true;
    bool valid16 = true;
    for (size_t i=0; i<accels.size(); i++) {
      valid1 &= (bool) accels[i]->intersectors.intersector1;
      valid4 &= (bool) accels[i]->intersectors.intersector4;
      valid8 &= (bool) accels[i]->intersectors.intersector8;
      valid16 &= (bool) accels[i]->intersectors.intersector16;
    }

    if (accels.size() == 1) {
      type = accels[0]->type; // FIXME: should just assign entire Accel
      bounds = accels[0]->bounds;
      intersectors = accels[0]->intersectors;
    }
    else 
    {
      type = AccelData::TY_ACCELN;
      intersectors.ptr = this;
      intersectors.intersector1  = Intersector1(&intersect,&occluded,&pointQuery,valid1 ? "AccelN::intersector1": nullptr);
      intersectors.intersector4  = Intersector4(&intersect4,&occluded4,valid4 ? "AccelN::intersector4" : nullptr);
      intersectors.intersector8  = Intersector8(&intersect8,&occluded8,valid8 ? "AccelN::intersector8" : nullptr);
      intersectors.intersector16 = Intersector16(&intersect16,&occluded16,valid16 ? "AccelN::intersector16": nullptr);

      /*! calculate bounds */
      bounds = empty;
      for (size_t i=0; i<accels.size(); i++) 
        bounds.extend(accels[i]->bounds);
    }
  }